

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t sysbvm_byteArray_create(sysbvm_context_t *context,sysbvm_tuple_t size)

{
  sysbvm_tuple_t sVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_type_tuple_t *byteArrayTypeObject;
  sysbvm_tuple_t size_local;
  sysbvm_context_t *context_local;
  
  if ((size == 0) && (sVar1 = (context->roots).byteArrayType, sVar1 != 0)) {
    if (*(long *)(sVar1 + 0x78) == 0) {
      psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).byteArrayType,0);
      *(sysbvm_object_tuple_t **)(sVar1 + 0x78) = psVar2;
    }
    context_local = *(sysbvm_context_t **)(sVar1 + 0x78);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocateByteTuple(context,(context->roots).byteArrayType,size);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_byteArray_create(sysbvm_context_t *context, sysbvm_tuple_t size)
{
    if(size == 0)
    {
        sysbvm_type_tuple_t *byteArrayTypeObject = (sysbvm_type_tuple_t*)context->roots.byteArrayType;
        if(byteArrayTypeObject)
        {
            if(!byteArrayTypeObject->emptyTrivialSingleton)
                byteArrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.byteArrayType, 0);
            return byteArrayTypeObject->emptyTrivialSingleton;
        }
    }

    return (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.byteArrayType, size);
}